

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromBinary(uchar *value,size_t size)

{
  ulong in_RDX;
  size_t extraout_RDX;
  long in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar1;
  size_t i;
  SimpleString *result;
  SimpleString *this;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  SimpleString *in_stack_ffffffffffffffc8;
  ulong local_28;
  
  this = in_RDI;
  SimpleString::SimpleString(in_RDI,(char *)in_RDI);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    StringFromFormat(&stack0xffffffffffffffc8,"%02X ",(ulong)*(byte *)(in_RSI + local_28));
    SimpleString::operator+=(this,in_RDI);
    SimpleString::~SimpleString((SimpleString *)0x1734e2);
  }
  SimpleString::size((SimpleString *)0x173528);
  SimpleString::subString
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  SimpleString::operator=(this,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17355c);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)this;
  return SVar1;
}

Assistant:

SimpleString StringFromBinary(const unsigned char* value, size_t size)
{
    SimpleString result;

    for (size_t i = 0; i < size; i++) {
        result += StringFromFormat("%02X ", value[i]);
    }
    result = result.subString(0, result.size() - 1);

    return result;
}